

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4db70::boolean::validate
          (boolean *this,json_pointer *ptr,json *instance,json_patch *param_3,error_handler *e)

{
  allocator<char> local_41;
  string local_40 [32];
  
  if (this->true_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_40,"instance invalid as per false-schema",&local_41);
    (*e->_vptr_error_handler[2])(e,ptr,instance,local_40);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &, error_handler &e) const override
	{
		if (!true_) { // false schema
			// empty array
			// switch (instance.type()) {
			// case json::value_t::array:
			//	if (instance.size() != 0) // valid false-schema
			//		e.error(ptr, instance, "false-schema required empty array");
			//	return;
			//}

			e.error(ptr, instance, "instance invalid as per false-schema");
		}
	}